

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

string * google::protobuf::compiler::js::anon_unknown_0::PostProcessFloat
                   (string *__return_storage_ptr__,string *result)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  allocator local_d1;
  string exponent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string mantissa;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar1 = std::operator==(result,"inf");
  if (bVar1) {
    pcVar3 = "Infinity";
  }
  else {
    bVar1 = std::operator==(result,"-inf");
    if (bVar1) {
      pcVar3 = "-Infinity";
    }
    else {
      bVar1 = std::operator==(result,"nan");
      if (!bVar1) {
        lVar2 = std::__cxx11::string::find((char)result,0x65);
        if (lVar2 != -1) {
          std::__cxx11::string::substr((ulong)&mantissa,(ulong)result);
          std::__cxx11::string::substr((ulong)&exponent,(ulong)result);
          lVar2 = std::__cxx11::string::find((char)&mantissa,0x2e);
          if (lVar2 == -1) {
            std::__cxx11::string::append((char *)&mantissa);
          }
          pcVar3 = "";
          if (exponent._M_string_length != 0) {
            if (*exponent._M_dataplus._M_p == '-') {
              std::__cxx11::string::substr((ulong)&local_b0,(ulong)&exponent);
              std::__cxx11::string::operator=((string *)&exponent,(string *)&local_b0);
              std::__cxx11::string::~string((string *)&local_b0);
              pcVar3 = "-";
            }
            else if (*exponent._M_dataplus._M_p == '+') {
              std::__cxx11::string::substr((ulong)&local_b0,(ulong)&exponent);
              std::__cxx11::string::operator=((string *)&exponent,(string *)&local_b0);
              std::__cxx11::string::~string((string *)&local_b0);
            }
          }
          while ((1 < exponent._M_string_length && (*exponent._M_dataplus._M_p == '0'))) {
            std::__cxx11::string::substr((ulong)&local_b0,(ulong)&exponent);
            std::__cxx11::string::operator=((string *)&exponent,(string *)&local_b0);
            std::__cxx11::string::~string((string *)&local_b0);
          }
          std::operator+(&local_50,&mantissa,"E");
          std::__cxx11::string::string((string *)&local_70,pcVar3,&local_d1);
          std::operator+(&local_b0,&local_50,&local_70);
          std::operator+(__return_storage_ptr__,&local_b0,&exponent);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&exponent);
          std::__cxx11::string::~string((string *)&mantissa);
          return __return_storage_ptr__;
        }
        lVar2 = std::__cxx11::string::find((char)result,0x2e);
        if (lVar2 == -1) {
          std::__cxx11::string::append((char *)result);
        }
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)result);
        return __return_storage_ptr__;
      }
      pcVar3 = "NaN";
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,(allocator *)&mantissa);
  return __return_storage_ptr__;
}

Assistant:

string PostProcessFloat(string result) {
  // If inf, -inf or nan, replace with +Infinity, -Infinity or NaN.
  if (result == "inf") {
    return "Infinity";
  } else if (result == "-inf") {
    return "-Infinity";
  } else if (result == "nan") {
    return "NaN";
  }

  // If scientific notation (e.g., "1e10"), (i) capitalize the "e", (ii)
  // ensure that the mantissa (portion prior to the "e") has at least one
  // fractional digit (after the decimal point), and (iii) strip any unnecessary
  // leading zeroes and/or '+' signs from the exponent.
  string::size_type exp_pos = result.find('e');
  if (exp_pos != string::npos) {
    string mantissa = result.substr(0, exp_pos);
    string exponent = result.substr(exp_pos + 1);

    // Add ".0" to mantissa if no fractional part exists.
    if (mantissa.find('.') == string::npos) {
      mantissa += ".0";
    }

    // Strip the sign off the exponent and store as |exp_neg|.
    bool exp_neg = false;
    if (!exponent.empty() && exponent[0] == '+') {
      exponent = exponent.substr(1);
    } else if (!exponent.empty() && exponent[0] == '-') {
      exp_neg = true;
      exponent = exponent.substr(1);
    }

    // Strip any leading zeroes off the exponent.
    while (exponent.size() > 1 && exponent[0] == '0') {
      exponent = exponent.substr(1);
    }

    return mantissa + "E" + string(exp_neg ? "-" : "") + exponent;
  }

  // Otherwise, this is an ordinary decimal number. Append ".0" if result has no
  // decimal/fractional part in order to match output of original codegen.
  if (result.find('.') == string::npos) {
    result += ".0";
  }

  return result;
}